

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

u32 utilNonce32(void)

{
  u32 uVar1;
  tm_ticks_t curticks;
  tm_time_t curtime;
  
  curtime = tmTime();
  uVar1 = utilFNV32(&curtime,8,0x811c9dc5);
  curticks = tmTicks();
  uVar1 = utilFNV32(&curticks,8,uVar1);
  return uVar1;
}

Assistant:

u32 utilNonce32()
{
	tm_time_t curtime;
	tm_ticks_t curticks;
	register u32 state = 2166136261u;
	// UNIX-время
	curtime = tmTime();
	state = utilFNV32(&curtime, sizeof(curtime), state);
	// число тактов
	curticks = tmTicks();
	state = utilFNV32(&curticks, sizeof(curticks), state);
	// еще?
	return state;
}